

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_bezier.cpp
# Opt level: O1

bool __thiscall ON_BezierCurve::IncreaseDegree(ON_BezierCurve *this,int desired_degree)

{
  int iVar1;
  bool bVar2;
  int order;
  
  if (desired_degree < 1) {
    return false;
  }
  bVar2 = true;
  if (this->m_order + -1 != desired_degree) {
    if (this->m_order <= desired_degree) {
      ReserveCVCapacity(this,(desired_degree + 1) * this->m_cv_stride);
      order = this->m_order;
      if (order <= desired_degree) {
        do {
          bVar2 = ON_IncreaseBezierDegree
                            (this->m_dim,this->m_is_rat != 0,order,this->m_cv_stride,this->m_cv);
          if (!bVar2) {
            return bVar2;
          }
          iVar1 = this->m_order;
          order = iVar1 + 1;
          this->m_order = order;
        } while (iVar1 < desired_degree);
        return bVar2;
      }
    }
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool ON_BezierCurve::IncreaseDegree( int desired_degree )
{
  bool rc = false;
  if ( desired_degree > 0 ) {
    if ( desired_degree == m_order-1 )
      rc = true;
    else if ( desired_degree >= m_order ) {
      ReserveCVCapacity( m_cv_stride*(desired_degree+1) );
      while ( m_order <= desired_degree ) {
        rc = ON_IncreaseBezierDegree( m_dim, m_is_rat, m_order, m_cv_stride, m_cv )?true:false;
        if ( !rc )
          break;
        m_order++;
      }
    }
  }
  return rc;
}